

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res)

{
  string *__lhs;
  bool bVar1;
  long lStack_30;
  
  __lhs = &req->method;
  bVar1 = std::operator==(__lhs,"GET");
  if ((bVar1) && (bVar1 = handle_file_request(this,req,res), bVar1)) {
    return true;
  }
  bVar1 = std::operator==(__lhs,"GET");
  lStack_30 = 0x38;
  if ((!bVar1) && (bVar1 = std::operator==(__lhs,"HEAD"), !bVar1)) {
    bVar1 = std::operator==(__lhs,"POST");
    if (bVar1) {
      lStack_30 = 0x50;
    }
    else {
      bVar1 = std::operator==(__lhs,"PUT");
      if (bVar1) {
        lStack_30 = 0x68;
      }
      else {
        bVar1 = std::operator==(__lhs,"DELETE");
        lStack_30 = 0x80;
        if (!bVar1) {
          bVar1 = std::operator==(__lhs,"OPTIONS");
          lStack_30 = 0x98;
          if (!bVar1) {
            return false;
          }
        }
      }
    }
  }
  bVar1 = dispatch_request(this,req,res,(Handlers *)((long)&this->_vptr_Server + lStack_30));
  return bVar1;
}

Assistant:

inline bool Server::routing(Request& req, Response& res)
{
    if (req.method == "GET" && handle_file_request(req, res)) {
        return true;
    }

    if (req.method == "GET" || req.method == "HEAD") {
        return dispatch_request(req, res, get_handlers_);
    } else if (req.method == "POST") {
        return dispatch_request(req, res, post_handlers_);
    } else if (req.method == "PUT") {
        return dispatch_request(req, res, put_handlers_);
    } else if (req.method == "DELETE") {
        return dispatch_request(req, res, delete_handlers_);
    } else if (req.method == "OPTIONS") {
        return dispatch_request(req, res, options_handlers_);
    }
    return false;
}